

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall VM::pop<int>(VM *this,int *out)

{
  StackFrame *this_00;
  reference ppSVar1;
  StackFrame *frame;
  int *out_local;
  VM *this_local;
  
  ppSVar1 = std::vector<StackFrame_*,_std::allocator<StackFrame_*>_>::back(&this->stack);
  this_00 = *ppSVar1;
  rmstack(this);
  *out = *(int *)this_00->ptr;
  if (this_00 != (StackFrame *)0x0) {
    StackFrame::~StackFrame(this_00);
    operator_delete(this_00);
  }
  return;
}

Assistant:

void pop(T& out) {
    StackFrame* frame = stack.back();
    rmstack();
    memcpy(&out,frame->ptr,sizeof(T));
    delete frame;
  }